

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall TPZMatrix<long>::Subst_Diag(TPZMatrix<long> *this,TPZFMatrix<long> *B)

{
  undefined1 auVar1 [16];
  long lVar2;
  TPZBaseMatrix *pTVar3;
  int iVar4;
  int64_t iVar5;
  long lVar6;
  long lVar7;
  int extraout_var;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  int64_t c;
  long pivot;
  int64_t r;
  char *in_stack_00000198;
  char *in_stack_000001a0;
  undefined8 local_30;
  long local_28;
  long local_20;
  long local_18;
  TPZBaseMatrix *local_10;
  
  local_10 = in_RSI;
  iVar5 = TPZBaseMatrix::Rows(in_RSI);
  lVar6 = (**(code **)(*in_RDI + 0x60))();
  if (iVar5 != lVar6) {
    Error(in_stack_000001a0,in_stack_00000198);
  }
  local_18 = 0;
  while( true ) {
    lVar6 = local_18;
    lVar7 = (**(code **)(*in_RDI + 0x60))();
    if (lVar7 <= lVar6) break;
    local_20 = (**(code **)(*in_RDI + 0x120))(in_RDI,local_18,local_18);
    local_28 = 0;
    while( true ) {
      lVar6 = local_28;
      iVar5 = TPZBaseMatrix::Cols(local_10);
      pTVar3 = local_10;
      lVar2 = local_18;
      lVar7 = local_28;
      if (iVar5 <= lVar6) break;
      iVar4 = (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_10,local_18,local_28);
      auVar1._4_4_ = extraout_var;
      auVar1._0_4_ = iVar4;
      auVar1._8_8_ = (long)extraout_var >> 0x1f;
      local_30 = SUB168(auVar1 / SEXT816(local_20),0);
      (*(pTVar3->super_TPZSavable)._vptr_TPZSavable[0x23])(pTVar3,lVar2,lVar7,&local_30);
      local_28 = local_28 + 1;
    }
    local_18 = local_18 + 1;
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != Dim())) {
        Error("TPZMatrix::Subst_Diag incompatible dimensions\n");
	}
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			B->PutVal( r, c, B->GetVal( r, c ) / pivot );
		}
	}
	return( 1 );
}